

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O3

void Llb_ManComputeIndCase(Aig_Man_t *p,DdManager *dd,Vec_Int_t *vNodes)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  Vec_Ptr_t *vBdds;
  void **__s;
  DdNode *pDVar7;
  DdNode *g;
  int iVar8;
  int iVar9;
  long lVar10;
  Aig_Obj_t *pObj;
  
  iVar6 = p->vObjs->nSize;
  vBdds = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar6 - 1U) {
    iVar8 = iVar6;
  }
  vBdds->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar8 << 3);
  }
  vBdds->pArray = __s;
  vBdds->nSize = iVar6;
  memset(__s,0,(long)iVar6 << 3);
  pDVar7 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar7);
  iVar8 = p->pConst1->Id;
  if (((long)iVar8 < 0) || (iVar6 <= iVar8)) {
LAB_0092fcfb:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  __s[iVar8] = pDVar7;
  if (0 < p->nTruePis) {
    lVar10 = 0;
    do {
      if (p->vCis->nSize <= lVar10) goto LAB_0092fcdc;
      pvVar2 = p->vCis->pArray[lVar10];
      pDVar7 = Cudd_bddIthVar(dd,p->nObjs[2] + (int)lVar10);
      Cudd_Ref(pDVar7);
      iVar8 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar8 < 0) || (iVar6 <= iVar8)) goto LAB_0092fcfb;
      __s[iVar8] = pDVar7;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nTruePis);
  }
  if (0 < p->nRegs) {
    iVar8 = p->nTruePos;
    iVar9 = 0;
    do {
      uVar5 = iVar8 + iVar9;
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar5)) goto LAB_0092fcdc;
      piVar3 = (int *)p->vCos->pArray[uVar5];
      pDVar7 = *(DdNode **)(piVar3 + 10);
      Cudd_Ref(pDVar7);
      if ((piVar3[6] & 7U) != 3) {
LAB_0092fd1a:
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      iVar8 = p->nTruePos;
      if (*piVar3 < iVar8) goto LAB_0092fd1a;
      uVar5 = (*piVar3 - iVar8) + p->nTruePis;
      if (((int)uVar5 < 0) || (p->vCis->nSize <= (int)uVar5)) goto LAB_0092fcdc;
      iVar1 = *(int *)((long)p->vCis->pArray[uVar5] + 0x24);
      if (((long)iVar1 < 0) || (iVar6 <= iVar1)) goto LAB_0092fcfb;
      __s[iVar1] = pDVar7;
      iVar9 = iVar9 + 1;
    } while (iVar9 < p->nRegs);
  }
  if (0 < vNodes->nSize) {
    lVar10 = 0;
    do {
      uVar5 = vNodes->pArray[lVar10];
      if (uVar5 < 2) {
        pVVar4 = p->vObjs;
        if (pVVar4 == (Vec_Ptr_t *)0x0) {
          pObj = (Aig_Obj_t *)0x0;
        }
        else {
          if (pVVar4->nSize <= lVar10) {
LAB_0092fcdc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj = (Aig_Obj_t *)pVVar4->pArray[lVar10];
        }
        g = Llb_ManComputeIndCase_rec(p,pObj,dd,vBdds);
        pDVar7 = (DdNode *)(pObj->field_5).pData;
        if (uVar5 == 0) {
          pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
          g = (DdNode *)((ulong)g ^ 1);
        }
        iVar6 = Cudd_bddLeq(dd,pDVar7,g);
        if (iVar6 == 0) {
          if (vNodes->nSize <= lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          vNodes->pArray[lVar10] = -1;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vNodes->nSize);
    iVar6 = vBdds->nSize;
    if (iVar6 < 1) goto LAB_0092fcb8;
  }
  lVar10 = 0;
  do {
    if ((DdNode *)vBdds->pArray[lVar10] != (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,(DdNode *)vBdds->pArray[lVar10]);
      iVar6 = vBdds->nSize;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 < iVar6);
LAB_0092fcb8:
  if (vBdds->pArray != (void **)0x0) {
    free(vBdds->pArray);
  }
  free(vBdds);
  return;
}

Assistant:

void Llb_ManComputeIndCase( Aig_Man_t * p, DdManager * dd, Vec_Int_t * vNodes )
{
    Vec_Ptr_t * vBdds;
    Aig_Obj_t * pObj;
    DdNode * bFunc;
    int i, Entry;
    vBdds = Vec_PtrStart( Aig_ManObjNumMax(p) );
    bFunc = Cudd_ReadOne(dd); Cudd_Ref( bFunc );
    Vec_PtrWriteEntry( vBdds, Aig_ObjId(Aig_ManConst1(p)), bFunc );
    Saig_ManForEachPi( p, pObj, i )
    {
        bFunc = Cudd_bddIthVar( dd, Aig_ManCiNum(p) + i );  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(pObj), bFunc );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        bFunc = (DdNode *)pObj->pData;  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(Saig_ObjLiToLo(p, pObj)), bFunc );
    }
    Vec_IntForEachEntry( vNodes, Entry, i )
    { 
        if ( Entry != 0 && Entry != 1 )
            continue;
        pObj = Aig_ManObj( p, i );
        bFunc = Llb_ManComputeIndCase_rec( p, pObj, dd, vBdds );
        if ( Entry == 0 )
        {
//            Extra_bddPrint( dd, Cudd_Not(pObj->pData) );  printf( "\n" );
//            Extra_bddPrint( dd, Cudd_Not(bFunc) );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, Cudd_Not(pObj->pData), Cudd_Not(bFunc) ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
        else if ( Entry == 1 )
        {
//            Extra_bddPrint( dd, pObj->pData );  printf( "\n" );
//            Extra_bddPrint( dd, bFunc );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, (DdNode *)pObj->pData, bFunc ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
    }
    Vec_PtrForEachEntry( DdNode *, vBdds, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vBdds );
}